

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceReleaseQueue.hpp
# Opt level: O0

void __thiscall
Diligent::ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper>::
DiscardResource<Diligent::DeviceContextVkImpl::DisposeVkCmdBuffer(Diligent::IndexWrapper<unsigned_char,Diligent::_SoftwareQueueIndexTag>,VkCommandBuffer_T*,unsigned_long)::CmdBufferRecycler,void>
          (ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper> *this,
          CmdBufferRecycler *Resource,Uint64 FenceValue)

{
  undefined1 local_28 [16];
  Uint64 FenceValue_local;
  CmdBufferRecycler *Resource_local;
  ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper> *this_local;
  
  local_28._8_8_ = FenceValue;
  FenceValue_local = (Uint64)Resource;
  Resource_local = (CmdBufferRecycler *)this;
  CreateWrapper<Diligent::DeviceContextVkImpl::DisposeVkCmdBuffer(Diligent::IndexWrapper<unsigned_char,Diligent::_SoftwareQueueIndexTag>,VkCommandBuffer_T*,unsigned_long)::CmdBufferRecycler,void>
            ((ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper> *)local_28,Resource,1);
  DiscardResource(this,(DynamicStaleResourceWrapper *)local_28,local_28._8_8_);
  DynamicStaleResourceWrapper::~DynamicStaleResourceWrapper((DynamicStaleResourceWrapper *)local_28)
  ;
  return;
}

Assistant:

void DiscardResource(ResourceType&& Resource, Uint64 FenceValue)
    {
        DiscardResource(CreateWrapper(std::move(Resource), 1), FenceValue);
    }